

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O1

int f_graddesc_test(void *data,int x,int z,double p)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  
  if ((*(char **)((long)data + 0x70) == (char *)0x0) ||
     (uVar4 = 1, **(char **)((long)data + 0x70) == '\0')) {
    lVar6 = (long)((x - *(int *)((long)data + 0x14)) +
                  (z - *(int *)((long)data + 0x18)) * *(int *)((long)data + 0x1c));
    uVar4 = 0;
    if (*(int *)(*(long *)((long)data + 8) + lVar6 * 4) == -1) {
      uVar5 = getBiomeAt(*data,*(int *)((long)data + 0x10),x,*(int *)((long)data + 0x24),z);
      uVar4 = uVar5 - 0x80 & 0xff;
      if ((int)uVar5 < 0x80) {
        uVar4 = uVar5;
      }
      *(uint *)(*(long *)((long)data + 8) + lVar6 * 4) = uVar5;
      puVar1 = (ulong *)((long)data + (ulong)(0x7f < (int)uVar5) * 8 + 0x30);
      *puVar1 = *puVar1 | 1L << ((byte)uVar4 & 0x3f);
      uVar2 = *(ulong *)((long)data + 0x50);
      uVar3 = *(ulong *)((long)data + 0x58);
      if ((uVar3 == 0 && uVar2 == 0) ||
         ((uVar4 = 1, (*(ulong *)((long)data + 0x30) & uVar2) == 0 &&
          ((*(ulong *)((long)data + 0x38) & uVar3) == 0)))) {
        bVar7 = true;
        if ((*(ulong *)((long)data + 0x30) & *(ulong *)((long)data + 0x60)) == 0) {
          bVar7 = (*(ulong *)((long)data + 0x38) & *(ulong *)((long)data + 0x68)) != 0;
        }
        bVar8 = false;
        if ((*(ulong *)((long)data + 0x40) & ~*(ulong *)((long)data + 0x30)) == 0) {
          bVar8 = (*(ulong *)((long)data + 0x48) & ~*(ulong *)((long)data + 0x38)) == 0;
        }
        uVar4 = (uint)(((bVar8 || *(ulong *)((long)data + 0x48) == 0 &&
                                  *(ulong *)((long)data + 0x40) == 0) &&
                       (bVar7 || *(ulong *)((long)data + 0x68) == 0 &&
                                 *(ulong *)((long)data + 0x60) == 0)) && (uVar3 == 0 && uVar2 == 0))
        ;
      }
    }
  }
  return uVar4;
}

Assistant:

static int f_graddesc_test(void *data, int x, int z, double p)
{
    (void) p;
    gdt_info_t *info = (gdt_info_t *) data;
    if (info->stop && *info->stop)
        return 1;
    int idx = (z - info->r.z) * info->r.sx + (x - info->r.x);
    if (info->ids[idx] != -1)
        return 0;
    int id = getBiomeAt(info->g, info->r.scale, x, info->r.y, z);
    info->ids[idx] = id;
    if (id < 128) info->b |= (1ULL << id);
    else info->m |= (1ULL << (id-128));

    // check if we know enough to stop
    int match_exc = (info->bexc|info->mexc) == 0;
    int match_any = (info->bany|info->many) == 0;
    int match_req = (info->breq|info->mreq) == 0;
    if (!match_exc && ((info->b & info->bexc) || (info->m & info->mexc)))
        return 1; // encountered an excluded biome -> stop
    match_any |= ((info->b & info->bany) || (info->m & info->many));
    match_req |= ((info->b & info->breq) == info->breq &&
                  (info->m & info->mreq) == info->mreq);
    if (match_exc && match_any && match_req)
        return 1; // all conditions met -> stop
    return 0;
}